

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocketclient.cpp
# Opt level: O1

void __thiscall session::session(session *this,io_context *ioc,context *ctx)

{
  object_type local_70;
  undefined1 local_60 [32];
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> local_40;
  
  (this->super_enable_shared_from_this<session>)._M_weak_this.
  super___weak_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<session>)._M_weak_this.
  super___weak_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.executor_.bits_ = 0;
  local_40.executor_.io_context_ = ioc;
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
  create_implementation<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
            ((basic_executor_type<std::allocator<void>,_0U> *)&local_40.impl_,&local_40);
  boost::asio::execution::
  any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
  ::
  any_executor<boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>
            ((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
              *)&local_70.__align,&local_40,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl(&(this->resolver_).impl_,(executor_type *)&local_70.__align);
  (*(code *)((execution_context *)local_60._0_8_)->service_registry_)();
  if (local_40.impl_.
      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_70._12_4_ = 0;
  local_70.__align = (anon_struct_8_0_00000001_for___align)ioc;
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
  create_implementation<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
            ((basic_executor_type<std::allocator<void>,_0U> *)local_60,&local_70);
  boost::beast::websocket::
  stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
  ::
  stream<boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>,boost::asio::ssl::context&>
            ((stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
              *)&this->ws_,
             (strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *)
             &local_70.__align,ctx);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  (this->buffer_).out_ = (char *)0x0;
  (this->buffer_).last_ = (char *)0x0;
  (this->buffer_).begin_ = (char *)0x0;
  (this->buffer_).in_ = (char *)0x0;
  (this->buffer_).end_ = (char *)0x0;
  (this->buffer_).max_ = 0x7fffffffffffffff;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

session::session(net::io_context &ioc, ssl::context &ctx)
        : resolver_(net::make_strand(ioc)), ws_(net::make_strand(ioc), ctx) {
}